

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O0

void btSolveL1T(btScalar *L,btScalar *B,int n,int lskip1)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  int iVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  int iVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  int j;
  int i;
  int lskip2;
  btScalar *ell;
  btScalar *ex;
  btScalar p4;
  btScalar p3;
  btScalar p2;
  btScalar q1;
  btScalar p1;
  btScalar m41;
  btScalar Z41;
  btScalar m31;
  btScalar Z31;
  btScalar m21;
  btScalar Z21;
  btScalar m11;
  btScalar Z11;
  int lskip1_local;
  int n_local;
  btScalar *B_local;
  btScalar *L_local;
  
  iVar11 = (n + -1) * (lskip1 + 1);
  iVar6 = -lskip1;
  for (i = 0; i <= n + -4; i = i + 4) {
    Z11 = 0.0;
    Z21 = 0.0;
    Z31 = 0.0;
    Z41 = 0.0;
    ell = L + ((long)iVar11 - (long)i);
    ex = B + (long)n + -1;
    iVar7 = i;
    while (j = iVar7 + -4, -1 < j) {
      fVar12 = *ell;
      fVar13 = *ex;
      pfVar1 = ell + -1;
      pfVar2 = ell + -2;
      pfVar3 = ell + -3;
      pfVar8 = ell + iVar6;
      fVar14 = ex[-1];
      pfVar9 = pfVar8 + iVar6;
      fVar4 = ex[-2];
      pfVar10 = pfVar9 + iVar6;
      fVar5 = ex[-3];
      ell = pfVar10 + iVar6;
      ex = ex + -4;
      Z11 = *pfVar10 * fVar5 + *pfVar9 * fVar4 + *pfVar8 * fVar14 + fVar12 * fVar13 + Z11;
      Z21 = pfVar10[-1] * fVar5 + pfVar9[-1] * fVar4 + pfVar8[-1] * fVar14 + *pfVar1 * fVar13 + Z21;
      Z31 = pfVar10[-2] * fVar5 + pfVar9[-2] * fVar4 + pfVar8[-2] * fVar14 + *pfVar2 * fVar13 + Z31;
      Z41 = pfVar10[-3] * fVar5 + pfVar9[-3] * fVar4 + pfVar8[-3] * fVar14 + *pfVar3 * fVar13 + Z41;
      iVar7 = j;
    }
    while (j = iVar7, 0 < j) {
      fVar12 = *ell;
      fVar13 = *ex;
      pfVar1 = ell + -1;
      pfVar2 = ell + -2;
      pfVar3 = ell + -3;
      ell = ell + iVar6;
      ex = ex + -1;
      Z11 = fVar12 * fVar13 + Z11;
      Z21 = *pfVar1 * fVar13 + Z21;
      Z31 = *pfVar2 * fVar13 + Z31;
      Z41 = *pfVar3 * fVar13 + Z41;
      iVar7 = j + -1;
    }
    fVar12 = *ex - Z11;
    *ex = fVar12;
    fVar13 = -ell[-1] * fVar12 + (ex[-1] - Z21);
    ex[-1] = fVar13;
    fVar14 = -ell[iVar6 + -2] * fVar13 + -ell[-2] * fVar12 + (ex[-2] - Z31);
    ex[-2] = fVar14;
    ex[-3] = -ell[lskip1 * -2 + -3] * fVar14 +
             -ell[iVar6 + -3] * fVar13 + -ell[-3] * fVar12 + (ex[-3] - Z41);
  }
  for (; i < n; i = i + 1) {
    Z11 = 0.0;
    ell = L + ((long)iVar11 - (long)i);
    ex = B + (long)n + -1;
    iVar7 = i;
    while (j = iVar7 + -4, -1 < j) {
      fVar12 = *ell;
      fVar13 = *ex;
      pfVar8 = ell + iVar6;
      pfVar1 = ex + -1;
      pfVar9 = pfVar8 + iVar6;
      pfVar2 = ex + -2;
      pfVar3 = ex + -3;
      ell = pfVar9 + iVar6 + iVar6;
      ex = ex + -4;
      Z11 = pfVar9[iVar6] * *pfVar3 + *pfVar9 * *pfVar2 + *pfVar8 * *pfVar1 + fVar12 * fVar13 + Z11;
      iVar7 = j;
    }
    while (j = iVar7, 0 < j) {
      fVar12 = *ell;
      fVar13 = *ex;
      ell = ell + iVar6;
      ex = ex + -1;
      Z11 = fVar12 * fVar13 + Z11;
      iVar7 = j + -1;
    }
    *ex = *ex - Z11;
  }
  return;
}

Assistant:

void btSolveL1T (const btScalar *L, btScalar *B, int n, int lskip1)
{  
  /* declare variables - Z matrix, p and q vectors, etc */
  btScalar Z11,m11,Z21,m21,Z31,m31,Z41,m41,p1,q1,p2,p3,p4,*ex;
  const btScalar *ell;
  int lskip2,i,j;
//  int lskip3;
  /* special handling for L and B because we're solving L1 *transpose* */
  L = L + (n-1)*(lskip1+1);
  B = B + n-1;
  lskip1 = -lskip1;
  /* compute lskip values */
  lskip2 = 2*lskip1;
  //lskip3 = 3*lskip1;
  /* compute all 4 x 1 blocks of X */
  for (i=0; i <= n-4; i+=4) {
    /* compute all 4 x 1 block of X, from rows i..i+4-1 */
    /* set the Z matrix to 0 */
    Z11=0;
    Z21=0;
    Z31=0;
    Z41=0;
    ell = L - i;
    ex = B;
    /* the inner loop that computes outer products and adds them to Z */
    for (j=i-4; j >= 0; j -= 4) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      p2=ell[-1];
      p3=ell[-2];
      p4=ell[-3];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      m21 = p2 * q1;
      m31 = p3 * q1;
      m41 = p4 * q1;
      ell += lskip1;
      Z11 += m11;
      Z21 += m21;
      Z31 += m31;
      Z41 += m41;
      /* load p and q values */
      p1=ell[0];
      q1=ex[-1];
      p2=ell[-1];
      p3=ell[-2];
      p4=ell[-3];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      m21 = p2 * q1;
      m31 = p3 * q1;
      m41 = p4 * q1;
      ell += lskip1;
      Z11 += m11;
      Z21 += m21;
      Z31 += m31;
      Z41 += m41;
      /* load p and q values */
      p1=ell[0];
      q1=ex[-2];
      p2=ell[-1];
      p3=ell[-2];
      p4=ell[-3];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      m21 = p2 * q1;
      m31 = p3 * q1;
      m41 = p4 * q1;
      ell += lskip1;
      Z11 += m11;
      Z21 += m21;
      Z31 += m31;
      Z41 += m41;
      /* load p and q values */
      p1=ell[0];
      q1=ex[-3];
      p2=ell[-1];
      p3=ell[-2];
      p4=ell[-3];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      m21 = p2 * q1;
      m31 = p3 * q1;
      m41 = p4 * q1;
      ell += lskip1;
      ex -= 4;
      Z11 += m11;
      Z21 += m21;
      Z31 += m31;
      Z41 += m41;
      /* end of inner loop */
    }
    /* compute left-over iterations */
    j += 4;
    for (; j > 0; j--) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      p2=ell[-1];
      p3=ell[-2];
      p4=ell[-3];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      m21 = p2 * q1;
      m31 = p3 * q1;
      m41 = p4 * q1;
      ell += lskip1;
      ex -= 1;
      Z11 += m11;
      Z21 += m21;
      Z31 += m31;
      Z41 += m41;
    }
    /* finish computing the X(i) block */
    Z11 = ex[0] - Z11;
    ex[0] = Z11;
    p1 = ell[-1];
    Z21 = ex[-1] - Z21 - p1*Z11;
    ex[-1] = Z21;
    p1 = ell[-2];
    p2 = ell[-2+lskip1];
    Z31 = ex[-2] - Z31 - p1*Z11 - p2*Z21;
    ex[-2] = Z31;
    p1 = ell[-3];
    p2 = ell[-3+lskip1];
    p3 = ell[-3+lskip2];
    Z41 = ex[-3] - Z41 - p1*Z11 - p2*Z21 - p3*Z31;
    ex[-3] = Z41;
    /* end of outer loop */
  }
  /* compute rows at end that are not a multiple of block size */
  for (; i < n; i++) {
    /* compute all 1 x 1 block of X, from rows i..i+1-1 */
    /* set the Z matrix to 0 */
    Z11=0;
    ell = L - i;
    ex = B;
    /* the inner loop that computes outer products and adds them to Z */
    for (j=i-4; j >= 0; j -= 4) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      ell += lskip1;
      Z11 += m11;
      /* load p and q values */
      p1=ell[0];
      q1=ex[-1];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      ell += lskip1;
      Z11 += m11;
      /* load p and q values */
      p1=ell[0];
      q1=ex[-2];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      ell += lskip1;
      Z11 += m11;
      /* load p and q values */
      p1=ell[0];
      q1=ex[-3];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      ell += lskip1;
      ex -= 4;
      Z11 += m11;
      /* end of inner loop */
    }
    /* compute left-over iterations */
    j += 4;
    for (; j > 0; j--) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      ell += lskip1;
      ex -= 1;
      Z11 += m11;
    }
    /* finish computing the X(i) block */
    Z11 = ex[0] - Z11;
    ex[0] = Z11;
  }
}